

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManComputeCuts(Of_Man_t *p)

{
  int iVar1;
  undefined8 uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Gia_Man_t *pGVar5;
  ulong uVar6;
  char *__function;
  char *__file;
  int *piVar7;
  char *__assertion;
  uint uVar8;
  uint *puVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  pGVar5 = p->pGia;
  if (0 < pGVar5->nObjs) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(undefined8 *)(&pGVar5->pObjs->field_0x0 + lVar13);
      uVar4 = (uint)uVar2;
      if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
        if ((((int)uVar4 < 0) || (uVar4 = uVar4 & 0x1fffffff, uVar4 == 0x1fffffff)) ||
           (uVar4 != ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff))) {
          Of_ObjMergeOrder(p,(int)lVar12);
        }
        else {
          iVar10 = (int)((ulong)-uVar4 + lVar12);
          if ((iVar10 < 0) || (iVar1 = (p->vCutFlows).nSize, iVar1 <= iVar10)) goto LAB_0073728d;
          if (iVar1 <= lVar12) {
LAB_007372c3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar6 = (ulong)-uVar4 + lVar12 & 0xffffffff;
          piVar7 = (p->vCutFlows).pArray;
          piVar7[lVar12] = piVar7[uVar6];
          iVar1 = (p->vCutDelays).nSize;
          if (iVar1 <= iVar10) goto LAB_0073728d;
          if (iVar1 <= lVar12) goto LAB_007372c3;
          piVar7 = (p->vCutDelays).pArray;
          piVar7[lVar12] = piVar7[uVar6];
        }
      }
      lVar12 = lVar12 + 1;
      pGVar5 = p->pGia;
      lVar13 = lVar13 + 0xc;
    } while (lVar12 < pGVar5->nObjs);
  }
  if ((0 < pGVar5->nObjs) && (pGVar3 = pGVar5->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
    lVar12 = 0;
    do {
      uVar2 = *(undefined8 *)(pGVar3 + lVar12);
      uVar4 = (uint)uVar2;
      if (((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) &&
         ((((int)uVar4 < 0 || ((uVar4 & 0x1fffffff) == 0x1fffffff)) ||
          ((uVar4 & 0x1fffffff) != ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff))))) {
        if ((p->vCutSets).nSize <= lVar12) goto LAB_0073728d;
        uVar4 = (p->vCutSets).pArray[lVar12];
        uVar8 = (int)uVar4 >> 0x10;
        if (((int)uVar8 < 0) || ((p->vPages).nSize <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if ((int)uVar4 < 1) {
          __assertion = "Of_ObjHasCuts(p, iObj)";
          __file = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
          ;
          __function = "void Of_ManLiftCuts(Of_Man_t *, int)";
          goto LAB_007372f7;
        }
        piVar7 = (int *)((ulong)((uVar4 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar8]);
        if (0 < *piVar7) {
          puVar9 = (uint *)(piVar7 + 1);
          iVar10 = 0;
          do {
            uVar6 = (ulong)(*puVar9 & 0x1f);
            if ((*puVar9 & 0x1f) != 0) {
              uVar11 = 0;
              do {
                if ((int)puVar9[uVar11 + 1] < 0) {
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf1,"int Abc_Var2Lit(int, int)");
                }
                puVar9[uVar11 + 1] = puVar9[uVar11 + 1] * 2;
                uVar6 = (ulong)(*puVar9 & 0x1f);
                uVar11 = uVar11 + 1;
              } while (uVar11 < uVar6);
            }
            iVar10 = iVar10 + 1;
            puVar9 = puVar9 + uVar6 + 4;
          } while (iVar10 < *piVar7);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pGVar5->nObjs);
  }
  return;
LAB_0073728d:
  __assertion = "i >= 0 && i < p->nSize";
  __file = 
  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
  ;
  __function = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_007372f7:
  __assert_fail(__assertion,__file,0x19e,__function);
}

Assistant:

void Of_ManComputeCuts( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iFanin;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0(pObj, i);
            Of_ObjSetCutFlow( p, i,  Of_ObjCutFlow(p, iFanin) );
            Of_ObjSetCutDelay( p, i, Of_ObjCutDelay(p, iFanin) );
        }
        else
            Of_ObjMergeOrder( p, i );
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( !Gia_ObjIsBuf(pObj) )
            Of_ManLiftCuts( p, i );
}